

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resources.cpp
# Opt level: O1

shared_ptr<PolledFile> __thiscall Resources::getFile(Resources *this,string *filename)

{
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledFile>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledFile>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledFile>_>_>_>
  *this_00;
  size_type *this_01;
  _Base_ptr p_Var1;
  iterator iVar2;
  PolledFile *this_02;
  mapped_type *pmVar3;
  key_type *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  shared_ptr<PolledFile> sVar5;
  string_view filename_00;
  long *local_d0;
  size_t local_c8;
  long local_c0 [2];
  path local_b0;
  path local_70;
  
  this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledFile>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledFile>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledFile>_>_>_>
             *)((long)&filename[3].field_2 + 8);
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledFile>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledFile>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledFile>_>_>_>
          ::find(this_00,in_RDX);
  if (iVar2._M_node == (_Base_ptr)(filename + 4)) {
    this_02 = (PolledFile *)operator_new(0x10);
    std::experimental::filesystem::v1::__cxx11::path::
    path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>(&local_70,in_RDX);
    std::experimental::filesystem::v1::__cxx11::path::path(&local_b0,(path *)filename);
    std::experimental::filesystem::v1::__cxx11::path::_M_append(&local_b0,&local_70._M_pathname);
    local_d0 = local_c0;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)&local_d0,local_b0._M_pathname._M_dataplus._M_p,
               local_b0._M_pathname._M_dataplus._M_p + local_b0._M_pathname._M_string_length);
    filename_00._M_str = (char *)local_d0;
    filename_00._M_len = local_c8;
    PolledFile::PolledFile(this_02,filename_00);
    (this->project_root_)._M_pathname._M_dataplus._M_p = (pointer)this_02;
    this_01 = &(this->project_root_)._M_pathname._M_string_length;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<PolledFile*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_01,this_02);
    if (local_d0 != local_c0) {
      operator_delete(local_d0,local_c0[0] + 1);
    }
    std::experimental::filesystem::v1::__cxx11::path::~path(&local_b0);
    std::experimental::filesystem::v1::__cxx11::path::~path(&local_70);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledFile>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledFile>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledFile>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledFile>_>_>_>
                           *)this_00,in_RDX);
    (pmVar3->super___shared_ptr<PolledFile,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)(this->project_root_)._M_pathname._M_dataplus._M_p;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pmVar3->super___shared_ptr<PolledFile,_(__gnu_cxx::_Lock_policy)2>)._M_refcount,
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_01);
    _Var4._M_pi = extraout_RDX_00;
  }
  else {
    (this->project_root_)._M_pathname._M_dataplus._M_p = *(pointer *)(iVar2._M_node + 2);
    p_Var1 = iVar2._M_node[2]._M_parent;
    (this->project_root_)._M_pathname._M_string_length = (size_type)p_Var1;
    _Var4._M_pi = extraout_RDX;
    if (p_Var1 != (_Base_ptr)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&p_Var1->_M_parent = *(int *)&p_Var1->_M_parent + 1;
        UNLOCK();
      }
      else {
        *(int *)&p_Var1->_M_parent = *(int *)&p_Var1->_M_parent + 1;
      }
    }
  }
  sVar5.super___shared_ptr<PolledFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var4._M_pi;
  sVar5.super___shared_ptr<PolledFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<PolledFile>)sVar5.super___shared_ptr<PolledFile,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<PolledFile> Resources::getFile(const std::string &filename) {
	const auto it = files_.find(filename);
	if (it != files_.end())
		return it->second;

	auto file = std::shared_ptr<PolledFile>(new PolledFile((project_root_/filename).string()));
	files_[filename] = file;
	return file;
}